

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

int __thiscall soplex::SVectorBase<double>::pos(SVectorBase<double> *this,int i)

{
  int iVar1;
  int in_ESI;
  SVectorBase<double> *in_RDI;
  int p;
  int n;
  int local_1c;
  
  if (in_RDI->m_elem != (Nonzero<double> *)0x0) {
    iVar1 = size(in_RDI);
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      if (in_RDI->m_elem[local_1c].idx == in_ESI) {
        return local_1c;
      }
    }
  }
  return -1;
}

Assistant:

int pos(int i) const
   {
      if(m_elem != nullptr)
      {
         int n = size();

         for(int p = 0; p < n; ++p)
         {
            if(m_elem[p].idx == i)
            {
               assert(index(p) == i);
               return p;
            }
         }
      }

      return -1;
   }